

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O1

void __thiscall Channel::handleEvent(Channel *this)

{
  long lVar1;
  long lVar2;
  __shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  ChannelPtr guard;
  
  if (this->fd_ == -1) {
    return;
  }
  std::__shared_ptr<Channel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Channel,void>
            (local_20,(__weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)this);
  if (((this->revents_ & 0x11U) == 0x10) &&
     ((this->closeCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->closeCallback_)._M_invoker)((_Any_data *)&this->closeCallback_);
  }
  if ((this->revents_ & 8) != 0) {
    if ((this->errorCallback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      if ((this->closeCallback_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_0010c0cb;
      lVar1 = 0xa0;
      lVar2 = 0x88;
    }
    else {
      lVar1 = 0x80;
      lVar2 = 0x68;
    }
    (**(code **)((long)&(this->super_enable_shared_from_this<Channel>)._M_weak_this.
                        super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar1))
              ((long)&(this->super_enable_shared_from_this<Channel>)._M_weak_this.
                      super___weak_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar2);
  }
LAB_0010c0cb:
  if (((this->revents_ & 0x2003) != 0) &&
     ((this->readCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->readCallback_)._M_invoker)((_Any_data *)&this->readCallback_);
  }
  if (((this->revents_ & 4) != 0) &&
     ((this->writeCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->writeCallback_)._M_invoker)((_Any_data *)&this->writeCallback_);
  }
  if (guard.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               guard.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void Channel::handleEvent() {
    if (fd_ == -1) return;
    ChannelPtr guard(shared_from_this());
    if ((revents_ & EPOLLHUP) && !(revents_ & EPOLLIN)) {
        if(closeCallback_) closeCallback_();
    }
    if (revents_ & EPOLLERR) {
        if (errorCallback_) errorCallback_();
        else if (closeCallback_) closeCallback_();
    }
    if (revents_ & (EPOLLIN | EPOLLPRI | EPOLLRDHUP)) {
        if(readCallback_) readCallback_();
    }
    if(revents_ & EPOLLOUT) {
        if(writeCallback_) writeCallback_();
    }
}